

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void dequantize_row_iq2_xxs(block_iq2_xxs *x,float *y,int64_t k)

{
  float *pfVar1;
  float fVar2;
  byte bVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  ulong uVar9;
  undefined1 auVar10 [13];
  long lVar11;
  long lVar12;
  int l;
  long lVar13;
  long lVar14;
  int ib32;
  long lVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  char cVar22;
  char cVar28;
  uint uVar23;
  char cVar26;
  char cVar27;
  uint uVar29;
  undefined1 auVar25 [16];
  undefined8 local_38;
  uint32_t aux32 [2];
  undefined1 auVar24 [12];
  
  lVar11 = k + 0xff;
  if (-1 < k) {
    lVar11 = k;
  }
  if (0xff < k) {
    lVar12 = 0;
    do {
      fVar2 = ggml_table_f32_f16[x[lVar12].d];
      lVar15 = 0;
      do {
        local_38 = *(undefined8 *)(x[lVar12].qs + lVar15 * 4);
        uVar5 = (uint)((ulong)*(undefined8 *)(x[lVar12].qs + lVar15 * 4) >> 0x20);
        fVar16 = ((float)(uVar5 >> 0x1c) + 0.5) * fVar2 * 0.25;
        lVar13 = 0;
        do {
          bVar3 = *(byte *)((long)&local_38 + lVar13);
          auVar17 = ZEXT216(CONCAT11(""[uVar5 >> ((char)lVar13 * '\a' & 0x1fU) & 0x7f],
                                     ""[uVar5 >> ((char)lVar13 * '\a' & 0x1fU) & 0x7f]));
          auVar17 = pshuflw(auVar17,auVar17,0);
          lVar14 = 0;
          do {
            uVar4 = *(undefined4 *)((long)iq2xxs_grid + lVar14 + (ulong)bVar3 * 8);
            uVar9 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
            auVar6._8_4_ = 0;
            auVar6._0_8_ = uVar9;
            auVar6[0xc] = (char)((uint)uVar4 >> 0x18);
            auVar7[8] = (char)((uint)uVar4 >> 0x10);
            auVar7._0_8_ = uVar9;
            auVar7[9] = 0;
            auVar7._10_3_ = auVar6._10_3_;
            auVar10._5_8_ = 0;
            auVar10._0_5_ = auVar7._8_5_;
            auVar8[4] = (char)((uint)uVar4 >> 8);
            auVar8._0_4_ = (int)uVar9;
            auVar8[5] = 0;
            auVar8._6_7_ = SUB137(auVar10 << 0x40,6);
            fVar18 = (float)(int)uVar9 * fVar16;
            fVar19 = (float)auVar8._4_4_ * fVar16;
            fVar20 = (float)auVar7._8_4_ * fVar16;
            fVar21 = (float)(uint3)(auVar6._10_3_ >> 0x10) * fVar16;
            auVar25 = ZEXT416(*(uint *)(kmask_iq2xs + lVar14)) & auVar17;
            cVar28 = auVar25[3];
            cVar27 = auVar25[2];
            cVar26 = auVar25[1];
            cVar22 = auVar25[0];
            uVar23 = CONCAT13(-(cVar22 == '\0'),
                              CONCAT12(-(cVar22 == '\0'),
                                       CONCAT11(-(cVar22 == '\0'),-(cVar22 == '\0'))));
            auVar24._0_8_ =
                 CONCAT17(-(cVar26 == '\0'),
                          CONCAT16(-(cVar26 == '\0'),
                                   CONCAT15(-(cVar26 == '\0'),CONCAT14(-(cVar26 == '\0'),uVar23))));
            auVar24[8] = -(cVar27 == '\0');
            auVar24[9] = -(cVar27 == '\0');
            auVar24[10] = -(cVar27 == '\0');
            auVar24[0xb] = -(cVar27 == '\0');
            auVar25[0xc] = -(cVar28 == '\0');
            auVar25._0_12_ = auVar24;
            auVar25[0xd] = -(cVar28 == '\0');
            auVar25[0xe] = -(cVar28 == '\0');
            auVar25[0xf] = -(cVar28 == '\0');
            uVar29 = (uint)((ulong)auVar24._0_8_ >> 0x20);
            pfVar1 = y + lVar14;
            *pfVar1 = (float)(~uVar23 & (uint)-fVar18 | (uint)fVar18 & uVar23);
            pfVar1[1] = (float)(~uVar29 & (uint)-fVar19 | (uint)fVar19 & uVar29);
            pfVar1[2] = (float)(~auVar24._8_4_ & (uint)-fVar20 | (uint)fVar20 & auVar24._8_4_);
            pfVar1[3] = (float)(~auVar25._12_4_ & (uint)-fVar21 | (uint)fVar21 & auVar25._12_4_);
            lVar14 = lVar14 + 4;
          } while (lVar14 != 8);
          y = y + 8;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 4);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 8);
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar11 >> 8);
  }
  return;
}

Assistant:

void dequantize_row_iq2_xxs(const block_iq2_xxs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    uint32_t aux32[2];
    const uint8_t * aux8 = (const uint8_t *)aux32;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            memcpy(aux32, x[i].qs + 4*ib32, 2*sizeof(uint32_t));
            const float db = d * (0.5f + (aux32[1] >> 28)) * 0.25f;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2xxs_grid + aux8[l]);
                const uint8_t  signs = ksigns_iq2xs[(aux32[1] >> 7*l) & 127];
                for (int j = 0; j < 8; ++j) {
                    y[j] = db * grid[j] * (signs & kmask_iq2xs[j] ? -1.f : 1.f);
                }
                y += 8;
            }
        }
    }
}